

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O2

double __thiscall
EncoderVelocity::GetEncoderVelocityPredicted(EncoderVelocity *this,double percent_threshold)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = GetEncoderVelocity(this);
  dVar2 = GetEncoderAcceleration(this,percent_threshold);
  dVar3 = (double)this->runPeriod * this->clkPeriod;
  dVar4 = ((double)this->velPeriod * this->clkPeriod * 0.5 + dVar3) * dVar2 + dVar1;
  dVar2 = 0.0;
  if (0.0 <= dVar1) {
    if (0.0 < dVar1) {
      if (0.0 <= dVar4) {
        dVar2 = dVar4;
      }
      if (1.0 < dVar3 * dVar2) {
        dVar2 = 1.0 / dVar3;
      }
    }
  }
  else {
    if (dVar4 <= 0.0) {
      dVar2 = dVar4;
    }
    if (dVar3 * dVar2 < -1.0) {
      dVar2 = -1.0 / dVar3;
    }
  }
  return dVar2;
}

Assistant:

double EncoderVelocity::GetEncoderVelocityPredicted(double percent_threshold) const
{
    double encVel = GetEncoderVelocity();
    double encAcc = GetEncoderAcceleration(percent_threshold);
    // The encoder measurement delay is half the measured period, based on the assumption that measuring the
    // period over a full cycle (4 quadrature counts) estimates the velocity in the middle of that cycle.
    double encDelay = velPeriod*clkPeriod/2.0;
    double encRun = GetEncoderRunningCounterSeconds();
    double deltaVel = encAcc*(encDelay+encRun);
    double predVel = encVel+deltaVel;
    if (encVel < 0) {
        // Do not change velocity direction
        if (predVel > 0.0)
            predVel = 0.0;
        // Maximum velocity limited by 1 count (i.e., we know
        // that a count has not happened for encRun seconds)
        if (predVel*encRun < -1.0)
            predVel = -1.0/encRun;
    }
    else if (encVel > 0.0) {
        // Do not change velocity direction
        if (predVel < 0.0)
            predVel = 0.0;
        // Maximum velocity limited by 1 count (i.e., we know
        // that a count has not happened for encRun seconds)
        if (predVel*encRun > 1.0)
            predVel = 1.0/encRun;
    }
    else {
        // If not moving, do not attempt to predict
        predVel = 0.0;
    }
    return predVel;
}